

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O0

void __thiscall
test_vector_operators_orthogonal_projection_Test::~test_vector_operators_orthogonal_projection_Test
          (test_vector_operators_orthogonal_projection_Test *this)

{
  test_vector_operators_orthogonal_projection_Test *this_local;
  
  ~test_vector_operators_orthogonal_projection_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, orthogonal_projection) {
  Vector_Dense<Scalar, 0> dynamic_vector = {4.0, -2.0, 3.0};
  Vector_Dense<Scalar, 0> dynamic_unit = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_unit = {0.0, 1.0 / std::sqrt(2.0), 1.0 / std::sqrt(2.0)};

  Vector_Dense<Scalar, 0> dynamic_result = projection_orthogonal(dynamic_vector, dynamic_unit);
  Vector_Dense<Scalar, 3> static_result = projection_orthogonal(static_vector, static_unit);
  EXPECT_DOUBLE_EQ(dynamic_result[0], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_result[1], -2.0);
  EXPECT_DOUBLE_EQ(dynamic_result[2], 3.0);
  EXPECT_DOUBLE_EQ(static_result[0], -1.0);
  EXPECT_NEAR(static_result[1], 0.5, std::numeric_limits<double>::epsilon() * 10.0);
  EXPECT_DOUBLE_EQ(static_result[2], -0.5);

  EXPECT_DEATH(projection_orthogonal(dynamic_vector, Vector_Dense<Scalar, 0>({1.0, 2.0})), "./*");
  EXPECT_DEATH(projection_orthogonal(static_vector, Vector_Dense<Scalar, 2>({1.0, 2.0})), "./*");
}